

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
          (RepeatedField<absl::lts_20250127::Cord> *this)

{
  ulong uVar1;
  uint uVar2;
  ThreadSafeArena *this_00;
  char *pcVar3;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  this_00 = &GetArena(this,(uVar1 & 4) == 0)->impl_;
  if (this_00 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated(this_00);
  }
  uVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (0 < (int)uVar2) {
    if ((uVar1 & 4) == 0) {
      pcVar3 = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      pcVar3 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    std::
    for_each<absl::lts_20250127::Cord_const*,google::protobuf::RepeatedField<absl::lts_20250127::Cord>::Destroy(absl::lts_20250127::Cord_const*,absl::lts_20250127::Cord_const*)::_lambda(absl::lts_20250127::Cord_const&)_1_>
              (pcVar3,pcVar3 + (ulong)uVar2 * 0x10);
  }
  UnpoisonBuffer(this);
  if ((uVar1 & 4) != 0) {
    InternalDeallocate<true>(this);
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  StaticValidityCheck();
  const bool is_soo = this->is_soo();
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds if arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena(is_soo);
  if (arena) (void)arena->SpaceAllocated();
#endif
  const int size = this->size(is_soo);
  if (size > 0) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem, elem + size);
  }
  UnpoisonBuffer();
  if (!is_soo) InternalDeallocate<true>();
}